

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DynamicMessageTest_Arena_Test::TestBody
          (DynamicMessageTest_Arena_Test *this)

{
  Message *oneof_message;
  Message *packed_message;
  Message *extension_message;
  Message *message;
  Arena arena;
  DynamicMessageTest_Arena_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&message);
  Message::New((this->super_DynamicMessageTest).prototype_,(Arena *)&message);
  Message::New((this->super_DynamicMessageTest).extensions_prototype_,(Arena *)&message);
  Message::New((this->super_DynamicMessageTest).packed_prototype_,(Arena *)&message);
  Message::New((this->super_DynamicMessageTest).oneof_prototype_,(Arena *)&message);
  Arena::~Arena((Arena *)&message);
  return;
}

Assistant:

TEST_P(DynamicMessageTest, Arena) {
  Arena arena;
  Message* message = prototype_->New(&arena);
  Message* extension_message = extensions_prototype_->New(&arena);
  Message* packed_message = packed_prototype_->New(&arena);
  Message* oneof_message = oneof_prototype_->New(&arena);

  // avoid unused-variable error.
  (void)message;
  (void)extension_message;
  (void)packed_message;
  (void)oneof_message;
  // Return without freeing: should not leak.
}